

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

ktx_error_code_e ktxPrintKTX2InfoTextForStream(ktxStream *stream)

{
  ktx_error_code_e kVar1;
  KTX_header2 header;
  KTX_header2 local_58;
  
  if (stream != (ktxStream *)0x0) {
    kVar1 = (*stream->read)(stream,&local_58,0xc);
    if (kVar1 == KTX_SUCCESS) {
      kVar1 = KTX_UNKNOWN_FILE_FORMAT;
      if (local_58.identifier._8_4_ == 0xa1a0a0d && local_58.identifier._0_8_ == -0x44cfcddfa7abb455
         ) {
        kVar1 = (*stream->read)(stream,&local_58.vkFormat,0x44);
        if (kVar1 == KTX_SUCCESS) {
          kVar1 = printKTX2Info2(stream,&local_58);
        }
      }
    }
    return kVar1;
  }
  __assert_fail("stream != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                ,0x46e,"ktx_error_code_e ktxPrintKTX2InfoTextForStream(ktxStream *)");
}

Assistant:

KTX_error_code
ktxPrintKTX2InfoTextForStream(ktxStream* stream)
{
    ktx_uint8_t ktx2_ident_ref[12] = KTX2_IDENTIFIER_REF;
    KTX_header2 header;
    KTX_error_code result;

    assert(stream != NULL);

    result = stream->read(stream, &header, sizeof(ktx2_ident_ref));
    if (result != KTX_SUCCESS)
        return result;

    // Compare identifier, is this a KTX2 file?
    if (memcmp(header.identifier, ktx2_ident_ref, 12))
        return KTX_UNKNOWN_FILE_FORMAT;

    // Read rest of header.
    result = stream->read(stream, &header.vkFormat, KTX2_HEADER_SIZE - sizeof(ktx2_ident_ref));
    if (result != KTX_SUCCESS)
        return result;

    result = printKTX2Info2(stream, &header);
    return result;
}